

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_compressEnd(ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  ZSTD_compressionStage_e ZVar1;
  size_t sVar2;
  size_t sVar3;
  XXH64_hash_t XVar4;
  size_t err_code;
  undefined4 *puVar5;
  undefined4 *dst_00;
  ulong dstCapacity_00;
  size_t err_code_1;
  size_t sStackY_40;
  
  sVar2 = ZSTD_compressContinue_internal(cctx,dst,dstCapacity,src,srcSize,1,1);
  sStackY_40 = sVar2;
  if (sVar2 < 0xffffffffffffff89) {
    ZVar1 = cctx->stage;
    if (ZVar1 == ZSTDcs_created) {
      sStackY_40 = 0xffffffffffffffc4;
    }
    else {
      dst_00 = (undefined4 *)((long)dst + sVar2);
      dstCapacity_00 = dstCapacity - sVar2;
      puVar5 = dst_00;
      if (ZVar1 != ZSTDcs_ending) {
        if (ZVar1 == ZSTDcs_init) {
          sVar3 = ZSTD_writeFrameHeader(dst_00,dstCapacity_00,&cctx->appliedParams,0,0);
          if (0xffffffffffffff88 < sVar3) {
            return sVar3;
          }
          dstCapacity_00 = dstCapacity_00 - sVar3;
          cctx->stage = ZSTDcs_ongoing;
          puVar5 = (undefined4 *)(sVar3 + (long)dst_00);
        }
        if (dstCapacity_00 < 4) {
          return 0xffffffffffffffba;
        }
        *puVar5 = 1;
        dstCapacity_00 = dstCapacity_00 - 3;
        puVar5 = (undefined4 *)((long)puVar5 + 3);
      }
      if ((cctx->appliedParams).fParams.checksumFlag != 0) {
        XVar4 = XXH64_digest(&cctx->xxhState);
        if (dstCapacity_00 < 4) {
          return 0xffffffffffffffba;
        }
        *puVar5 = (int)XVar4;
        puVar5 = puVar5 + 1;
      }
      cctx->stage = ZSTDcs_created;
      sStackY_40 = (long)puVar5 - (long)dst_00;
      if (sStackY_40 < 0xffffffffffffff89) {
        if ((cctx->pledgedSrcSizePlusOne == 0) ||
           (cctx->pledgedSrcSizePlusOne == cctx->consumedSrcSize + 1)) {
          ZSTD_CCtx_trace(cctx,sStackY_40);
          sStackY_40 = sStackY_40 + sVar2;
        }
        else {
          sStackY_40 = 0xffffffffffffffb8;
        }
      }
    }
  }
  return sStackY_40;
}

Assistant:

size_t ZSTD_compressEnd (ZSTD_CCtx* cctx,
                         void* dst, size_t dstCapacity,
                   const void* src, size_t srcSize)
{
    size_t endResult;
    size_t const cSize = ZSTD_compressContinue_internal(cctx,
                                dst, dstCapacity, src, srcSize,
                                1 /* frame mode */, 1 /* last chunk */);
    FORWARD_IF_ERROR(cSize, "ZSTD_compressContinue_internal failed");
    endResult = ZSTD_writeEpilogue(cctx, (char*)dst + cSize, dstCapacity-cSize);
    FORWARD_IF_ERROR(endResult, "ZSTD_writeEpilogue failed");
    assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
    if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
        ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
        DEBUGLOG(4, "end of frame : controlling src size");
        RETURN_ERROR_IF(
            cctx->pledgedSrcSizePlusOne != cctx->consumedSrcSize+1,
            srcSize_wrong,
             "error : pledgedSrcSize = %u, while realSrcSize = %u",
            (unsigned)cctx->pledgedSrcSizePlusOne-1,
            (unsigned)cctx->consumedSrcSize);
    }
    ZSTD_CCtx_trace(cctx, endResult);
    return cSize + endResult;
}